

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int64_t skip_stream(archive_read *a,size_t skip_bytes)

{
  long lVar1;
  archive_read *a_00;
  size_t in_RSI;
  archive *in_RDI;
  size_t bytes;
  int64_t skipped_bytes;
  void *p;
  _7zip *zip;
  size_t local_38;
  size_t minimum;
  archive_read *in_stack_fffffffffffffff8;
  
  minimum = *(size_t *)in_RDI[0x15].archive_format_name;
  local_38 = in_RSI;
  if (*(int *)(minimum + 0x100) == 0) {
    lVar1 = *(long *)(minimum + 0x38) + (ulong)*(uint *)(*(long *)(minimum + 0xa8) + 0x10) * 0x68;
    *(size_t *)(lVar1 + 0x60) = in_RSI + *(long *)(lVar1 + 0x60);
  }
  else {
    while( true ) {
      if (local_38 == 0) {
        return in_RSI;
      }
      a_00 = (archive_read *)read_stream(in_stack_fffffffffffffff8,(void **)in_RDI,in_RSI,minimum);
      if ((long)a_00 < 0) {
        return (int64_t)a_00;
      }
      if (a_00 == (archive_read *)0x0) break;
      local_38 = local_38 - (long)a_00;
      if (*(long *)(minimum + 0x120) != 0) {
        read_consume(a_00);
      }
    }
    archive_set_error(in_RDI,0x54,"Truncated 7-Zip file body");
    in_RSI = 0xffffffffffffffe2;
  }
  return in_RSI;
}

Assistant:

static int64_t
skip_stream(struct archive_read *a, size_t skip_bytes)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const void *p;
	int64_t skipped_bytes;
	size_t bytes = skip_bytes;

	if (zip->folder_index == 0) {
		/*
		 * Optimization for a list mode.
		 * Avoid unncecessary decoding operations.
		 */
		zip->si.ci.folders[zip->entry->folderIndex].skipped_bytes
		    += skip_bytes;
		return (skip_bytes);
	}

	while (bytes) {
		skipped_bytes = read_stream(a, &p, bytes, 0);
		if (skipped_bytes < 0)
			return (skipped_bytes);
		if (skipped_bytes == 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		bytes -= (size_t)skipped_bytes;
		if (zip->pack_stream_bytes_unconsumed)
			read_consume(a);
	}
	return (skip_bytes);
}